

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

BasicBlock * __thiscall spvtools::opt::Loop::FindLatchBlock(Loop *this)

{
  IRContext *this_00;
  CFG *this_01;
  Instruction *pIVar1;
  uint32_t *puVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  mapped_type *ppBVar6;
  uint32_t *puVar7;
  bool bVar8;
  uint32_t local_4c;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  mapped_type local_40;
  DominatorTree *local_38;
  
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  this_01 = (this_00->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_38 = (DominatorTree *)
             IRContext::GetDominatorAnalysis(this->context_,this->loop_header_->function_);
  pIVar1 = (this->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar4 = 0;
  if (pIVar1->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
  }
  pvVar5 = CFG::preds(this_01,uVar4);
  puVar7 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = puVar7 == puVar2;
  if (!bVar8) {
    local_48 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this_01->id2block_;
    do {
      uVar4 = *puVar7;
      pIVar1 = (this->loop_continue_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      a = 0;
      if (pIVar1->has_result_id_ == true) {
        a = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      bVar3 = DominatorTree::Dominates(local_38,a,uVar4);
      if (bVar3) {
        local_4c = uVar4;
        ppBVar6 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at(local_48,&local_4c);
        local_40 = *ppBVar6;
        break;
      }
      puVar7 = puVar7 + 1;
      bVar8 = puVar7 == puVar2;
    } while (!bVar8);
  }
  if (!bVar8) {
    return local_40;
  }
  __assert_fail("false && \"Every loop should have a latch block dominated by the continue target\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x15c,"BasicBlock *spvtools::opt::Loop::FindLatchBlock()");
}

Assistant:

BasicBlock* Loop::FindLatchBlock() {
  CFG* cfg = context_->cfg();

  DominatorAnalysis* dominator_analysis =
      context_->GetDominatorAnalysis(loop_header_->GetParent());

  // Look at the predecessors of the loop header to find a predecessor block
  // which is dominated by the loop continue target. There should only be one
  // block which meets this criteria and this is the latch block, as per the
  // SPIR-V spec.
  for (uint32_t block_id : cfg->preds(loop_header_->id())) {
    if (dominator_analysis->Dominates(loop_continue_->id(), block_id)) {
      return cfg->block(block_id);
    }
  }

  assert(
      false &&
      "Every loop should have a latch block dominated by the continue target");
  return nullptr;
}